

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

Result<wasm::Literal> *
wasm::WATParser::anon_unknown_22::const_(Result<wasm::Literal> *__return_storage_ptr__,Lexer *in)

{
  bool bVar1;
  uint *puVar2;
  Literal local_100;
  Literal local_e8;
  allocator<char> local_c9;
  string local_c8;
  Err local_a8;
  allocator<char> local_71;
  string local_70;
  Err local_50;
  _Optional_payload_base<unsigned_int> local_30;
  optional<unsigned_int> n;
  Lexer *in_local;
  
  _n = sv("ref.extern",10);
  bVar1 = Lexer::takeSExprStart(in,_n);
  if (bVar1) {
    local_30 = (_Optional_payload_base<unsigned_int>)Lexer::takeI32(in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
    if (bVar1) {
      bVar1 = Lexer::takeRParen(in);
      if (bVar1) {
        puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_30);
        wasm::Literal::makeI31(&local_100,*puVar2,Unshared);
        wasm::Literal::externalize(&local_e8,&local_100);
        Result<wasm::Literal>::Result<wasm::Literal>(__return_storage_ptr__,&local_e8);
        wasm::Literal::~Literal(&local_e8);
        wasm::Literal::~Literal(&local_100);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"expected end of ref.extern",&local_c9);
        Lexer::err(&local_a8,in,&local_c8);
        Result<wasm::Literal>::Result(__return_storage_ptr__,&local_a8);
        wasm::Err::~Err(&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected host reference payload",&local_71);
      Lexer::err(&local_50,in,&local_70);
      Result<wasm::Literal>::Result(__return_storage_ptr__,&local_50);
      wasm::Err::~Err(&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  else {
    parseConst(__return_storage_ptr__,in);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Literal> const_(Lexer& in) {
  if (in.takeSExprStart("ref.extern"sv)) {
    auto n = in.takeI32();
    if (!n) {
      return in.err("expected host reference payload");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of ref.extern");
    }
    // Represent host references as externalized i31s.
    return Literal::makeI31(*n, Unshared).externalize();
  }
  return parseConst(in);
}